

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opna.cpp
# Opt level: O1

void __thiscall YmFmOPNA::~YmFmOPNA(YmFmOPNA *this)

{
  void *pvVar1;
  long *plVar2;
  void *pvVar3;
  long lVar4;
  
  if (this->p != (YmFmOPNA_Private *)0x0) {
    operator_delete(this->p,0xfd0);
  }
  pvVar1 = this->m_chip;
  plVar2 = (long *)this->m_intf;
  pvVar3 = this->m_output;
  if (pvVar1 != (void *)0x0) {
    if (*(void **)((long)pvVar1 + 0xc18) != (void *)0x0) {
      operator_delete(*(void **)((long)pvVar1 + 0xc18),0x38);
    }
    *(undefined8 *)((long)pvVar1 + 0xc18) = 0;
    lVar4 = 0xbd8;
    do {
      if (*(void **)((long)pvVar1 + lVar4) != (void *)0x0) {
        operator_delete(*(void **)((long)pvVar1 + lVar4),0x30);
      }
      *(undefined8 *)((long)pvVar1 + lVar4) = 0;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0xba8);
    *(undefined ***)((long)pvVar1 + 0x10) = &PTR_engine_timer_expired_00220450;
    lVar4 = 0xb28;
    do {
      if (*(void **)((long)pvVar1 + lVar4) != (void *)0x0) {
        operator_delete(*(void **)((long)pvVar1 + lVar4),0x50);
      }
      *(undefined8 *)((long)pvVar1 + lVar4) = 0;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0xa68);
    lVar4 = 0xa68;
    do {
      if (*(void **)((long)pvVar1 + lVar4) != (void *)0x0) {
        operator_delete(*(void **)((long)pvVar1 + lVar4),0x48);
      }
      *(undefined8 *)((long)pvVar1 + lVar4) = 0;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0xa38);
    operator_delete(pvVar1,0xc38);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x48))(plVar2);
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,0xc);
    return;
  }
  return;
}

Assistant:

YmFmOPNA::~YmFmOPNA()
{
    delete p;
    ymfm::ym2608 *chip_r = reinterpret_cast<ymfm::ym2608*>(m_chip);
    ymfm::ymfm_interface *intf_r = reinterpret_cast<ymfm::ymfm_interface*>(m_intf);
    ymfm::ym2608::output_data *output_r = reinterpret_cast<ymfm::ym2608::output_data*>(m_output);
    delete chip_r;
    delete intf_r;
    delete output_r;
}